

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void rgb_gray_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  _func_void_j_decompress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  JSAMPARRAY ppJVar7;
  uint local_74;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  INT32 *ctab;
  int b;
  int g;
  int r;
  my_cconvert_ptr cconvert;
  JSAMPARRAY ppJStack_28;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  p_Var2 = cinfo->cconvert[3].start_pass;
  uVar1 = cinfo->output_width;
  cconvert._4_4_ = num_rows;
  ppJStack_28 = output_buf;
  output_buf_local._4_4_ = input_row;
  while (cconvert._4_4_ = cconvert._4_4_ + -1, -1 < cconvert._4_4_) {
    pJVar3 = (*input_buf)[output_buf_local._4_4_];
    pJVar4 = input_buf[1][output_buf_local._4_4_];
    pJVar5 = input_buf[2][output_buf_local._4_4_];
    output_buf_local._4_4_ = output_buf_local._4_4_ + 1;
    ppJVar7 = ppJStack_28 + 1;
    pJVar6 = *ppJStack_28;
    for (local_74 = 0; ppJStack_28 = ppJVar7, local_74 < uVar1; local_74 = local_74 + 1) {
      pJVar6[local_74] =
           (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uint)pJVar3[local_74] * 8) +
                             *(long *)(p_Var2 + (long)(int)(pJVar4[local_74] + 0x100) * 8) +
                            *(long *)(p_Var2 + (long)(int)(pJVar5[local_74] + 0x200) * 8)) >> 0x10);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_gray_convert (j_decompress_ptr cinfo,
		  JSAMPIMAGE input_buf, JDIMENSION input_row,
		  JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_y_tab;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      r = GETJSAMPLE(inptr0[col]);
      g = GETJSAMPLE(inptr1[col]);
      b = GETJSAMPLE(inptr2[col]);
      /* Y */
      outptr[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
    }
  }
}